

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

EnumValueOptions * __thiscall
google::protobuf::Arena::DoCreateMessage<google::protobuf::EnumValueOptions>(Arena *this)

{
  void *ptr;
  EnumValueOptions *pEVar1;
  Arena *local_18;
  Arena *local_10;
  Arena *this_local;
  
  local_10 = this;
  ptr = AllocateInternal(this,0x50,8,(_func_void_void_ptr *)0x0,
                         (type_info *)&EnumValueOptions::typeinfo);
  local_18 = this;
  pEVar1 = InternalHelper<google::protobuf::EnumValueOptions>::Construct<google::protobuf::Arena*>
                     (ptr,&local_18);
  return pEVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* DoCreateMessage(Args&&... args) {
    return InternalHelper<T>::Construct(
        AllocateInternal(sizeof(T), alignof(T),
                         internal::ObjectDestructor<
                             InternalHelper<T>::is_destructor_skippable::value,
                             T>::destructor,
                         RTTI_TYPE_ID(T)),
        this, std::forward<Args>(args)...);
  }